

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O2

void __thiscall deqp::egl::Image::ImageTests::addCreateRenderbufferActions(ImageTests *this)

{
  allocator<char> local_29;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"renderbuffer_rgba4",&local_29);
  addCreateRenderbuffer(this,&local_28,0x8056);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"renderbuffer_rgb5_a1",&local_29);
  addCreateRenderbuffer(this,&local_28,0x8057);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"renderbuffer_rgb565",&local_29);
  addCreateRenderbuffer(this,&local_28,0x8d62);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"renderbuffer_depth16",&local_29);
  addCreateRenderbuffer(this,&local_28,0x81a5);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"renderbuffer_stencil",&local_29);
  addCreateRenderbuffer(this,&local_28,0x8d48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void ImageTests::addCreateRenderbufferActions (void)
{
	addCreateRenderbuffer("renderbuffer_rgba4",		GL_RGBA4);
	addCreateRenderbuffer("renderbuffer_rgb5_a1",	GL_RGB5_A1);
	addCreateRenderbuffer("renderbuffer_rgb565",	GL_RGB565);
	addCreateRenderbuffer("renderbuffer_depth16",	GL_DEPTH_COMPONENT16);
	addCreateRenderbuffer("renderbuffer_stencil",	GL_STENCIL_INDEX8);
}